

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

bool __thiscall QThreadPoolPrivate::waitForDone(QThreadPoolPrivate *this,QDeadlineTimer *timer)

{
  QMutex *this_00;
  bool bVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mutex;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = this_00;
  QBasicMutex::lock(&this_00->super_QBasicMutex);
  local_48[8] = true;
  qVar2 = 0;
  while (((this->queue).d.size != 0 || (this->activeThreads != 0))) {
    bVar1 = QDeadlineTimer::hasExpired(timer);
    if (bVar1) {
      qVar2 = (this->queue).d.size;
      bVar1 = this->activeThreads == 0;
LAB_0038230a:
      bVar1 = (bool)(qVar2 == 0 & bVar1);
      if (bVar1 == true) {
        reset(this);
      }
      QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar1;
      }
      __stack_chk_fail();
    }
    QWaitCondition::wait(&this->noActiveThreads,this_00);
  }
  bVar1 = true;
  goto LAB_0038230a;
}

Assistant:

bool QThreadPoolPrivate::waitForDone(const QDeadlineTimer &timer)
{
    QMutexLocker locker(&mutex);
    while (!(queue.isEmpty() && activeThreads == 0) && !timer.hasExpired())
        noActiveThreads.wait(&mutex, timer);

    if (!queue.isEmpty() || activeThreads)
        return false;

    reset();
    // New jobs might have started during reset, but return anyway
    // as the active thread and task count did reach 0 once, and
    // race conditions are outside our scope.
    return true;
}